

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O1

bool __thiscall MipsParser::parseVpfxsParameter(MipsParser *this,Parser *parser,int *result)

{
  TokenType TVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  Token *pTVar6;
  void *pvVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  TokenSequence tokens;
  TokenSequence tokens_00;
  TokenSequence tokens_01;
  TokenSequence tokens_02;
  TokenSequence tokens_03;
  TokenSequence tokens_04;
  TokenSequence tokens_05;
  TokenSequence tokens_06;
  TokenValueSequence values;
  TokenValueSequence values_00;
  TokenValueSequence values_01;
  TokenValueSequence values_02;
  TokenValueSequence values_03;
  TokenValueSequence values_04;
  TokenValueSequence values_05;
  TokenValueSequence values_06;
  int constNum;
  TokenType local_5c [3];
  TokenSequenceValue local_50;
  undefined4 local_40;
  undefined8 local_38;
  
  if (parseVpfxsParameter(Parser&,int&)::sequenceParser == '\0') {
    parseVpfxsParameter();
  }
  if (parseVpfxsParameter::sequenceParser.entries.
      super__Vector_base<TokenSequenceParser::Entry,_std::allocator<TokenSequenceParser::Entry>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      parseVpfxsParameter::sequenceParser.entries.
      super__Vector_base<TokenSequenceParser::Entry,_std::allocator<TokenSequenceParser::Entry>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_5c[0] = Integer;
    local_50.type = Integer;
    local_50.field_1.textValue = (char *)0x0;
    tokens._M_len = 1;
    tokens._M_array = local_5c;
    values._M_len = 1;
    values._M_array = &local_50;
    TokenSequenceParser::addEntry(&parseVpfxsParameter::sequenceParser,0,tokens,values);
    local_5c[0] = Integer;
    local_50.type = Integer;
    local_50.field_1.intValue = 1;
    tokens_00._M_len = 1;
    tokens_00._M_array = local_5c;
    values_00._M_len = 1;
    values_00._M_array = &local_50;
    TokenSequenceParser::addEntry(&parseVpfxsParameter::sequenceParser,1,tokens_00,values_00);
    local_5c[0] = 2;
    local_50.type = Integer;
    local_50.field_1.intValue = 2;
    tokens_01._M_len = 1;
    tokens_01._M_array = local_5c;
    values_01._M_len = 1;
    values_01._M_array = &local_50;
    TokenSequenceParser::addEntry(&parseVpfxsParameter::sequenceParser,2,tokens_01,values_01);
    local_5c[0] = Integer;
    local_5c[1] = Div;
    local_5c[2] = 2;
    local_50.type = Integer;
    local_50.field_1.intValue = 1;
    local_40 = 2;
    local_38 = 2;
    tokens_02._M_len = 3;
    tokens_02._M_array = local_5c;
    values_02._M_len = 2;
    values_02._M_array = &local_50;
    TokenSequenceParser::addEntry(&parseVpfxsParameter::sequenceParser,3,tokens_02,values_02);
    local_5c[0] = 2;
    local_50.type = Integer;
    local_50.field_1.intValue = 3;
    tokens_03._M_len = 1;
    tokens_03._M_array = local_5c;
    values_03._M_len = 1;
    values_03._M_array = &local_50;
    TokenSequenceParser::addEntry(&parseVpfxsParameter::sequenceParser,4,tokens_03,values_03);
    local_5c[0] = Integer;
    local_5c[1] = Div;
    local_5c[2] = 2;
    local_50.type = Integer;
    local_50.field_1.intValue = 1;
    local_40 = 2;
    local_38 = 3;
    tokens_04._M_len = 3;
    tokens_04._M_array = local_5c;
    values_04._M_len = 2;
    values_04._M_array = &local_50;
    TokenSequenceParser::addEntry(&parseVpfxsParameter::sequenceParser,5,tokens_04,values_04);
    local_5c[0] = Integer;
    local_5c[1] = Div;
    local_5c[2] = 2;
    local_50.type = Integer;
    local_50.field_1.intValue = 1;
    local_40 = 2;
    local_38 = 4;
    tokens_05._M_len = 3;
    tokens_05._M_array = local_5c;
    values_05._M_len = 2;
    values_05._M_array = &local_50;
    TokenSequenceParser::addEntry(&parseVpfxsParameter::sequenceParser,6,tokens_05,values_05);
    local_5c[0] = Integer;
    local_5c[1] = Div;
    local_5c[2] = 2;
    local_50.type = Integer;
    local_50.field_1.intValue = 1;
    local_40 = 2;
    local_38 = 6;
    tokens_06._M_len = 3;
    tokens_06._M_array = local_5c;
    values_06._M_len = 2;
    values_06._M_array = &local_50;
    TokenSequenceParser::addEntry(&parseVpfxsParameter::sequenceParser,7,tokens_06,values_06);
  }
  pTVar6 = Tokenizer::nextToken
                     ((parser->entries).
                      super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer);
  if (pTVar6->type == LBrack) {
    lVar9 = 0;
    uVar8 = 0;
    bVar10 = false;
    do {
      pTVar6 = Tokenizer::nextToken
                         ((parser->entries).
                          super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                          _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer);
      if (lVar9 == 0) {
LAB_00168e55:
        bVar2 = (byte)uVar8;
        if (pTVar6->type == Minus) {
          *result = *result | 0x10000 << (bVar2 & 0x1f);
          pTVar6 = Tokenizer::nextToken
                             ((parser->entries).
                              super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>
                              ._M_impl.super__Vector_impl_data._M_finish[-1].tokenizer);
        }
        TVar1 = pTVar6->type;
        if (TVar1 == BitOr) {
          *result = *result | 0x100 << (bVar2 & 0x1f);
          pTVar6 = Tokenizer::nextToken
                             ((parser->entries).
                              super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>
                              ._M_impl.super__Vector_impl_data._M_finish[-1].tokenizer);
        }
        bVar3 = true;
        if (pTVar6->type == Identifier) {
          if (*(__index_type *)
               ((long)&(pTVar6->value).
                       super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                       super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                       .
                       super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                       .
                       super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                       .
                       super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                       .
                       super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
               + 0x20) != '\x04') {
            __assert_fail("std::holds_alternative<Identifier>(value)",
                          "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Parser/Tokenizer.h"
                          ,0x4d,"const Identifier &Token::identifierValue() const");
          }
          if ((*(long *)((long)&(pTVar6->value).
                                super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                .
                                super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                .
                                super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                .
                                super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                .
                                super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                .
                                super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                        + 8) == 1) &&
             (pvVar7 = memchr("xyzw",(int)**(char **)&(pTVar6->value).
                                                                                                            
                                                  super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                                  .
                                                  super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                                  .
                                                  super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                                  .
                                                  super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                                  .
                                                  super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                                  .
                                                  super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                                  ._M_u,5), pvVar7 != (void *)0x0)) {
            *result = *result | (int)pvVar7 + -0x190bb4 << ((byte)lVar9 & 0x3f);
            if ((TVar1 != BitOr) ||
               (pTVar6 = Tokenizer::nextToken
                                   ((parser->entries).
                                    super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>
                                    ._M_impl.super__Vector_impl_data._M_finish[-1].tokenizer),
               pTVar6->type == BitOr)) {
              bVar3 = false;
            }
          }
          else if (TVar1 != BitOr) {
            *result = *result | 0x1000 << (bVar2 & 0x1f);
            local_50.type = ~Invalid;
            bVar4 = TokenSequenceParser::parse
                              (&parseVpfxsParameter::sequenceParser,parser,(int *)&local_50);
            bVar3 = true;
            if (bVar4) {
              uVar5 = (local_50.type & String) << ((byte)lVar9 & 0x1f) | *result;
              *result = uVar5;
              bVar3 = false;
              if ((local_50.type & Float) != Invalid) {
                *result = uVar5 | 0x100 << (bVar2 & 0x1f);
              }
            }
          }
        }
      }
      else {
        bVar3 = true;
        if (pTVar6->type == Comma) {
          pTVar6 = Tokenizer::nextToken
                             ((parser->entries).
                              super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>
                              ._M_impl.super__Vector_impl_data._M_finish[-1].tokenizer);
          goto LAB_00168e55;
        }
      }
      if (bVar3) {
        if (!bVar10) goto LAB_00168fbc;
        break;
      }
      bVar10 = 2 < uVar8;
      uVar8 = uVar8 + 1;
      lVar9 = lVar9 + 2;
    } while (uVar8 != 4);
    pTVar6 = Tokenizer::nextToken
                       ((parser->entries).
                        super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                        _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer);
    bVar10 = pTVar6->type == RBrack;
  }
  else {
LAB_00168fbc:
    bVar10 = false;
  }
  return bVar10;
}

Assistant:

bool MipsParser::parseVpfxsParameter(Parser& parser, int& result)
{
	static TokenSequenceParser sequenceParser;

	// initialize on first use
	if (sequenceParser.getEntryCount() == 0)
	{
		// 0
		sequenceParser.addEntry(0, {TokenType::Integer}, {INT64_C(0)} );
		// 1
		sequenceParser.addEntry(1, {TokenType::Integer}, {INT64_C(1)} );
		// 2
		sequenceParser.addEntry(2, {TokenType::Integer}, {INT64_C(2)} );
		// 1/2
		sequenceParser.addEntry(3, {TokenType::Integer, TokenType::Div, TokenType::Integer}, {INT64_C(1), INT64_C(2)} );
		// 3
		sequenceParser.addEntry(4, {TokenType::Integer}, {INT64_C(3)} );
		// 1/3
		sequenceParser.addEntry(5, {TokenType::Integer, TokenType::Div, TokenType::Integer}, {INT64_C(1), INT64_C(3)} );
		// 1/4
		sequenceParser.addEntry(6, {TokenType::Integer, TokenType::Div, TokenType::Integer}, {INT64_C(1), INT64_C(4)} );
		// 1/6
		sequenceParser.addEntry(7, {TokenType::Integer, TokenType::Div, TokenType::Integer}, {INT64_C(1), INT64_C(6)} );
	}

	if (parser.nextToken().type != TokenType::LBrack)
		return false;
	
	for (int i = 0; i < 4; i++)
	{
		const Token *tokenFinder = &parser.nextToken();

		if (i != 0)
		{
			if (tokenFinder->type != TokenType::Comma)
				return false;

			tokenFinder = &parser.nextToken();
		}
		
		// negation
		if (tokenFinder->type == TokenType::Minus)
		{
			result |= 1 << (16+i);
			tokenFinder = &parser.nextToken();
		}

		// abs
		bool abs = false;
		if (tokenFinder->type == TokenType::BitOr)
		{
			result |= 1 << (8+i);
			abs = true;
			tokenFinder = &parser.nextToken();
		}

		const Token& token = *tokenFinder;
		if (token.type != TokenType::Identifier)
			return false;

		// check for register
		const char* reg;
		static const char* vpfxstRegisters = "xyzw";
		const std::string &stringValue = token.identifierValue().string();
		if (stringValue.size() == 1 && (reg = strchr(vpfxstRegisters,stringValue[0])) != nullptr)
		{
			result |= (reg-vpfxstRegisters) << (i*2);

			if (abs && parser.nextToken().type != TokenType::BitOr)
				return false;

			continue;
		}
		
		// abs is invalid with constants
		if (abs)
			return false;

		result |= 1 << (12+i);

		int constNum = -1;
		if (!sequenceParser.parse(parser,constNum))
			return false;
		
		result |= (constNum & 3) << (i*2);
		if (constNum & 4)
			result |= 1 << (8+i);
	}

	return parser.nextToken().type == TokenType::RBrack;
}